

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * __thiscall
cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
          (string *__return_storage_ptr__,SystemTools *this,bool collapse)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  char buf [2048];
  string local_848;
  char local_828 [2056];
  
  __s = getcwd(local_828,0x800);
  paVar1 = &local_848.field_2;
  local_848._M_string_length = 0;
  local_848.field_2._M_local_buf[0] = '\0';
  local_848._M_dataplus._M_p = (pointer)paVar1;
  if (__s != (char *)0x0) {
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_848,0,(char *)0x0,(ulong)__s);
  }
  if ((char)this == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_848._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_848.field_2._M_allocated_capacity._1_7_,local_848.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_848.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_848._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_848.field_2._M_allocated_capacity._1_7_,local_848.field_2._M_local_buf[0])
      ;
    }
    __return_storage_ptr__->_M_string_length = local_848._M_string_length;
  }
  else {
    CollapseFullPath(__return_storage_ptr__,&local_848,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_848._M_dataplus._M_p != paVar1) {
      operator_delete(local_848._M_dataplus._M_p,
                      CONCAT71(local_848.field_2._M_allocated_capacity._1_7_,
                               local_848.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetCurrentWorkingDirectory(bool collapse)
{
  char buf[2048];
  const char* cwd = Getcwd(buf, 2048);
  std::string path;
  if (cwd) {
    path = cwd;
  }
  if (collapse) {
    return SystemTools::CollapseFullPath(path);
  }
  return path;
}